

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_ff84f::CheckVariableConflict
          (anon_unknown_dwarf_ff84f *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint uVar1;
  TypeBase *pTVar2;
  IdentifierLookupResult *pIVar3;
  NamespaceData *pNVar4;
  ScopeData *pSVar5;
  ulong uVar6;
  char *msg;
  InplaceStr name_00;
  InplaceStr local_20;
  
  pSVar5 = (ScopeData *)name.begin;
  local_20.begin = (char *)source;
  local_20.end = (char *)pSVar5;
  uVar1 = InplaceStr::hash(&local_20);
  pTVar2 = LookupTypeByName((ExpressionContext *)this,uVar1);
  if (pTVar2 != (TypeBase *)0x0) {
    uVar6 = (ulong)(uint)((int)local_20.end - (int)local_20.begin);
    msg = "ERROR: name \'%.*s\' is already taken for a type";
    goto LAB_001d890b;
  }
  uVar1 = InplaceStr::hash(&local_20);
  pIVar3 = LookupObjectByName((ExpressionContext *)this,uVar1);
  if (pIVar3 != (IdentifierLookupResult *)0x0) {
    pSVar5 = (ScopeData *)pIVar3->variable;
    if ((pSVar5 != (ScopeData *)0x0) &&
       (pSVar5 = (ScopeData *)pSVar5->ownerNamespace, pSVar5 == *(ScopeData **)(this + 0x8158))) {
      uVar6 = (ulong)(uint)((int)local_20.end - (int)local_20.begin);
      msg = "ERROR: name \'%.*s\' is already taken for a variable in current scope";
      goto LAB_001d890b;
    }
    if ((pIVar3->function != (FunctionData *)0x0) &&
       (pIVar3->function->scope == *(ScopeData **)(this + 0x8158))) {
      uVar6 = (ulong)(uint)((int)local_20.end - (int)local_20.begin);
      msg = "ERROR: name \'%.*s\' is already taken for a function";
      goto LAB_001d890b;
    }
  }
  name_00.end = (char *)pSVar5;
  name_00.begin = local_20.end;
  pNVar4 = FindNamespaceInCurrentScope(this,(ExpressionContext *)local_20.begin,name_00);
  if (pNVar4 == (NamespaceData *)0x0) {
    return false;
  }
  uVar6 = (ulong)(uint)((int)local_20.end - (int)local_20.begin);
  msg = "ERROR: name \'%.*s\' is already taken for a namespace";
LAB_001d890b:
  Report((ExpressionContext *)this,(SynBase *)ctx,msg,uVar6);
  return true;
}

Assistant:

bool CheckVariableConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(LookupTypeByName(ctx, name.hash()))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name));
			return true;
		}

		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
				return true;
			}

			if(lookup->function && lookup->function->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a function", FMT_ISTR(name));
				return true;
			}
		}

		if(FindNamespaceInCurrentScope(ctx, name))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
			return true;
		}

		return false;
	}